

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash_handler.c
# Opt level: O0

ion_err_t linear_hash_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_dictionary_parent_t *piVar1;
  ion_err_t result;
  int records_per_bucket;
  int split_threshold;
  int initial_size;
  ion_dictionary_compare_t compare_local;
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  
  piVar1 = (ion_dictionary_parent_t *)malloc(0x78);
  dictionary->instance = piVar1;
  if (dictionary->instance == (ion_dictionary_parent_t *)0x0) {
    key_type_local._3_1_ = 6;
  }
  else {
    dictionary->instance->compare = compare;
    key_type_local._3_1_ =
         linear_hash_init(id,dictionary_size,key_type,key_size,value_size,4,0x55,4,
                          (linear_hash_table_t *)dictionary->instance);
    if ((key_type_local._3_1_ == key_type_numeric_signed >> 0x18) &&
       (handler != (ion_dictionary_handler_t *)0x0)) {
      dictionary->handler = handler;
      dictionary->instance->type = dictionary_type_linear_hash_t;
    }
  }
  return key_type_local._3_1_;
}

Assistant:

ion_err_t
linear_hash_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	int initial_size, split_threshold, records_per_bucket;

	dictionary->instance = malloc(sizeof(linear_hash_table_t));

	if (NULL == dictionary->instance) {
		return err_out_of_memory;
	}

	dictionary->instance->compare	= compare;

	initial_size					= 4;
	split_threshold					= 85;
	records_per_bucket				= 4;

	/* TODO Should we handle the possible error code returned by this? If yes, what sorts of errors does it return? */
	ion_err_t result = linear_hash_init(id, dictionary_size, key_type, key_size, value_size, initial_size, split_threshold, records_per_bucket, (linear_hash_table_t *) dictionary->instance);

	if ((err_ok == result) && (NULL != handler)) {
		dictionary->handler			= handler;
		dictionary->instance->type	= dictionary_type_linear_hash_t;
	}

	return result;
}